

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O2

void test_contains_all(void)

{
  _Bool _Var1;
  bitset_t *b1;
  bitset_t *b2;
  undefined8 uVar2;
  int i;
  ulong i_00;
  
  b1 = bitset_create();
  b2 = bitset_create();
  for (i_00 = 0; i_00 != 1000; i_00 = i_00 + 1) {
    bitset_set(b1,i_00);
    if ((i_00 & 1) == 0) {
      bitset_set(b2,i_00);
    }
  }
  _Var1 = bitset_contains_all(b1,b2);
  if (_Var1) {
    _Var1 = bitset_contains_all(b2,b1);
    if (_Var1) {
      uVar2 = 0xf9;
    }
    else {
      bitset_set(b2,0x3e9);
      _Var1 = bitset_contains_all(b1,b2);
      if (_Var1) {
        uVar2 = 0xfd;
      }
      else {
        _Var1 = bitset_contains_all(b2,b1);
        if (!_Var1) {
          bitset_free(b1);
          bitset_free(b2);
          return;
        }
        uVar2 = 0xfe;
      }
    }
  }
  else {
    uVar2 = 0xf8;
  }
  fprintf(_stderr,"Assertion failed in %s at line %d\n","test_contains_all",uVar2);
  exit(1);
}

Assistant:

void test_contains_all() {
  bitset_t *superset = bitset_create();
  bitset_t *subset = bitset_create();

  for (int i = 0; i < 1000; i++) {
    bitset_set(superset, i);
    if (i % 2 == 0)
      bitset_set(subset, i);
  }

  TEST_ASSERT(bitset_contains_all(superset, subset));
  TEST_ASSERT(!bitset_contains_all(subset, superset));

  bitset_set(subset, 1001);

  TEST_ASSERT(!bitset_contains_all(superset, subset));
  TEST_ASSERT(!bitset_contains_all(subset, superset));

  bitset_free(superset);
  bitset_free(subset);
}